

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidSchema.cc
# Opt level: O3

void __thiscall avro::ValidSchema::ValidSchema(ValidSchema *this)

{
  Node *node;
  Schema local_28;
  
  node = (Node *)operator_new(0x18);
  node->type_ = AVRO_NULL;
  node->locked_ = false;
  node->_vptr_Node = (_func_int **)&PTR__Node_00191c58;
  Schema::Schema(&local_28,node);
  local_28._vptr_Schema = (_func_int **)&PTR__Schema_001922f0;
  (this->root_).px = local_28.node_.px;
  (this->root_).pn.pi_ = local_28.node_.pn.pi_;
  if (local_28.node_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_28.node_.pn.pi_)->use_count_ = (local_28.node_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  Schema::~Schema(&local_28);
  validate(&this->root_);
  return;
}

Assistant:

ValidSchema::ValidSchema() : root_(NullSchema().root()) 
{
    validate(root_);
}